

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rfc5444_msg_generator.c
# Opt level: O1

rfc5444_result
rfc5444_writer_create_message
          (rfc5444_writer *writer,uint8_t msgid,uint8_t addr_len,rfc5444_writer_targetselector useIf
          ,void *param)

{
  byte bVar1;
  byte bVar2;
  ushort uVar3;
  list_entity *plVar4;
  list_entity *plVar5;
  list_entity *plVar6;
  list_entity *plVar7;
  list_entity **pplVar8;
  uint8_t *puVar9;
  ulong uVar10;
  _Bool _Var11;
  char cVar12;
  bool bVar13;
  rfc5444_result rVar14;
  int iVar15;
  rfc5444_writer_message *prVar16;
  ulong uVar17;
  list_entity *plVar18;
  avl_node *paVar19;
  undefined1 uVar20;
  uint uVar21;
  rfc5444_writer_target *prVar22;
  rfc5444_writer_address *last_addr;
  list_entity *plVar23;
  int *piVar24;
  int iVar25;
  ulong uVar26;
  int iVar27;
  rfc5444_writer_message *prVar28;
  int iVar29;
  rfc5444_writer_target *param_00;
  ulong uVar30;
  long lVar31;
  list_entity *plVar32;
  list_entity current_list;
  _rfc5444_internal_addr_compress_session acs [16];
  uint8_t local_251;
  rfc5444_writer_message *local_250;
  undefined4 local_244;
  rfc5444_writer_targetselector local_240;
  rfc5444_writer_target *local_238;
  int local_230;
  int local_22c;
  list_entity local_228;
  rfc5444_writer_address *local_218;
  ulong local_210;
  rfc5444_writer_message *local_208;
  ulong *local_200;
  list_entity *local_1f8;
  uint local_1ec;
  rfc5444_writer_address *local_1e8;
  list_entity **local_1e0;
  ulong local_1d8;
  rfc5444_writer_address *local_1d0;
  ulong local_1c8 [2];
  _rfc5444_internal_addr_compress_session local_1b8 [16];
  
  local_251 = msgid;
  local_240 = useIf;
  local_238 = (rfc5444_writer_target *)param;
  if (writer->_state != RFC5444_WRITER_NONE) {
    __assert_fail("writer->_state == RFC5444_WRITER_NONE",
                  "/workspace/llm4binary/github/license_c_cmakelists/OLSR[P]OONF/src/librfc5444/rfc5444_msg_generator.c"
                  ,0x86,
                  "enum rfc5444_result rfc5444_writer_create_message(struct rfc5444_writer *, uint8_t, uint8_t, rfc5444_writer_targetselector, void *)"
                 );
  }
  if (((writer->_targets).next != &writer->_targets) ||
     ((writer->_targets).prev != &writer->_targets)) {
    prVar16 = (rfc5444_writer_message *)avl_find(&writer->_msgcreators,&local_251);
    param_00 = local_238;
    if (prVar16 == (rfc5444_writer_message *)0x0) {
      return RFC5444_NO_MSGCREATOR;
    }
    if (prVar16->target_specific == true) {
      prVar22 = local_238;
      if (local_240 != rfc5444_writer_singletarget_selector) {
        plVar18 = (writer->_targets).next;
        if (plVar18->prev == (writer->_targets).prev) {
          return RFC5444_OKAY;
        }
        while( true ) {
          _Var11 = (*local_240)(writer,(rfc5444_writer_target *)(plVar18 + -3),local_238);
          if ((_Var11) &&
             (rVar14 = rfc5444_writer_create_message
                                 (writer,local_251,addr_len,rfc5444_writer_singletarget_selector,
                                  (rfc5444_writer_target *)(plVar18 + -3)), rVar14 != RFC5444_OKAY))
          break;
          plVar18 = plVar18->next;
          if (plVar18->prev == (writer->_targets).prev) {
            return RFC5444_OKAY;
          }
        }
        return rVar14;
      }
    }
    else {
      prVar22 = (rfc5444_writer_target *)0x0;
    }
    writer->msg_target = prVar22;
    writer->msg_addr_len = addr_len;
    plVar18 = (writer->_processors).list_head.next;
    local_250 = prVar16;
    if (plVar18->prev == (writer->_processors).list_head.prev) {
      lVar31 = 0;
    }
    else {
      lVar31 = 0;
      do {
        cVar12 = (*(code *)plVar18[4].next)(plVar18,prVar16->type);
        if (cVar12 != '\0') {
          lVar31 = lVar31 + (ulong)*(ushort *)((long)&plVar18[3].prev + 4);
        }
        plVar18 = plVar18->next;
      } while (plVar18->prev != (writer->_processors).list_head.prev);
    }
    uVar26 = writer->msg_size;
    local_208 = prVar16;
    for (plVar18 = (writer->_targets).next; plVar18->prev != (writer->_targets).prev;
        plVar18 = plVar18->next) {
      _Var11 = (*local_240)(writer,(rfc5444_writer_target *)(plVar18 + -3),param_00);
      if (_Var11) {
        if (*(char *)&plVar18[1].next == '\x01') {
          _rfc5444_writer_begin_packet(writer,(rfc5444_writer_target *)(plVar18 + -3));
        }
        uVar17 = (long)plVar18[-3].prev -
                 ((long)&(plVar18[2].prev)->next +
                 (long)&(plVar18[3].next)->next + (long)&(plVar18[2].next)->next + lVar31);
        if (uVar17 < uVar26) {
          uVar26 = uVar17;
        }
      }
    }
    _rfc5444_tlv_writer_init(&writer->_msg,uVar26,writer->msg_size);
    prVar16 = local_208;
    writer->_state = RFC5444_WRITER_ADD_HEADER;
    local_208->has_origaddr = false;
    local_208->has_hoplimit = false;
    local_208->has_hopcount = false;
    local_208->has_seqno = false;
    (writer->_msg).header = 6;
    if ((local_208->addMessageHeader ==
         (_func_int_rfc5444_writer_ptr_rfc5444_writer_message_ptr *)0x0) ||
       (iVar15 = (*local_208->addMessageHeader)(writer,local_208), iVar15 == 0)) {
      writer->_state = RFC5444_WRITER_ADD_MSGTLV;
      for (plVar18 = (prVar16->_provider_tree).list_head.next;
          plVar18->prev != (prVar16->_provider_tree).list_head.prev; plVar18 = plVar18->next) {
        if (plVar18[-2].prev != (list_entity *)0x0) {
          (*(code *)plVar18[-2].prev)();
        }
      }
      writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
      for (plVar18 = (prVar16->_provider_tree).list_head.next;
          plVar18->prev != (prVar16->_provider_tree).list_head.prev; plVar18 = plVar18->next) {
        if (plVar18[-1].next != (list_entity *)0x0) {
          (*(code *)plVar18[-1].next)();
        }
      }
      plVar18 = &local_250->_addr_head;
      plVar23 = &local_250->_non_mandatory_addr_head;
      plVar32 = (prVar16->_non_mandatory_addr_head).next;
      if ((plVar32 != plVar23) || ((prVar16->_non_mandatory_addr_head).prev != plVar23)) {
        ((prVar16->_addr_head).prev)->next = plVar32;
        ((prVar16->_non_mandatory_addr_head).next)->prev = (prVar16->_addr_head).prev;
        plVar32 = (prVar16->_non_mandatory_addr_head).prev;
        (prVar16->_addr_head).prev = plVar32;
        plVar32->next = plVar18;
        (prVar16->_non_mandatory_addr_head).prev = plVar23;
        (prVar16->_non_mandatory_addr_head).next = plVar23;
      }
      local_228.next = &local_228;
      plVar32 = plVar18->next;
      if ((plVar32 == plVar18) && ((prVar16->_addr_head).prev == plVar18)) {
        local_228.prev = local_228.next;
        _finalize_message_fragment(writer,prVar16,&local_228,true,local_240,param_00);
        writer->_state = RFC5444_WRITER_NONE;
        _rfc5444_writer_free_addresses(writer,prVar16);
        return RFC5444_OKAY;
      }
      local_210 = 0;
      if (plVar32 != plVar18) {
        iVar15 = (int)(writer->_msg).header + (int)(writer->_msg).allocated +
                 (int)(writer->_msg).added;
        local_1c8[0] = (ulong)(((int)uVar26 - iVar15) + 1);
        local_244 = (undefined4)CONCAT71((uint7)(uint3)((uint)iVar15 >> 8),1);
        local_1e8 = (rfc5444_writer_address *)0x0;
        last_addr = (rfc5444_writer_address *)0x0;
        local_22c = 0;
        local_230 = 0;
        local_1f8 = plVar18;
LAB_0011255a:
        local_228.next = &local_228;
        bVar13 = true;
        plVar18 = local_1f8;
        local_228.prev = local_228.next;
        do {
          if ((*(undefined1 *)((long)&plVar32[9].prev + 1) == '\x01') &&
             (*(char *)&plVar32[9].prev == '\0')) {
            plVar32 = plVar32->next;
          }
          else {
            local_218 = (rfc5444_writer_address *)&plVar32[-2].prev;
            local_1d0 = last_addr;
            if (bVar13) {
              for (plVar18 = (prVar16->_msgspecific_tlvtype_head).next;
                  plVar18->prev != (prVar16->_msgspecific_tlvtype_head).prev;
                  plVar18 = plVar18->next) {
                *(undefined8 *)((long)&plVar18[5].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[6].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[4].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[5].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[3].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[4].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[2].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[3].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[1].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[2].next + 4) = 0;
              }
              for (plVar18 = (writer->_addr_tlvtype_head).next;
                  plVar18->prev != (writer->_addr_tlvtype_head).prev; plVar18 = plVar18->next) {
                *(undefined8 *)((long)&plVar18[5].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[6].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[4].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[5].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[3].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[4].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[2].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[3].next + 4) = 0;
                *(undefined8 *)((long)&plVar18[1].prev + 4) = 0;
                *(undefined8 *)((long)&plVar18[2].next + 4) = 0;
              }
              memset(local_1b8,0,0x180);
              local_210 = 1;
              local_1e8 = local_218;
            }
            *(int *)&plVar32[-2].prev = local_22c;
            plVar32[1].next = &local_228;
            plVar32[1].prev = local_228.prev;
            pplVar8 = &(local_228.prev)->next;
            local_228.prev = plVar32 + 1;
            *pplVar8 = plVar32 + 1;
            plVar18 = local_228.prev;
            if (local_228.next == local_228.prev) {
              local_250 = (rfc5444_writer_message *)0x0;
            }
            else {
              local_250 = (rfc5444_writer_message *)&(local_228.prev)->prev[-3].prev;
            }
            bVar1 = writer->msg_addr_len;
            uVar26 = (ulong)bVar1;
            bVar2 = *(undefined1 *)((long)&local_228.prev[-2].prev + 5);
            local_200 = (ulong *)CONCAT44(local_200._4_4_,(uint)bVar2);
            if (local_250 == (rfc5444_writer_message *)0x0) {
              local_1d8 = 0;
            }
            else {
              uVar21 = (int)local_210 + 1;
              if (*(uint8_t *)((long)&(local_250->_msgcreator_node).parent + 5) != bVar2) {
                uVar21 = 1;
              }
              local_210 = (ulong)uVar21;
              uVar30 = 0;
              uVar17 = uVar30;
              if (uVar26 != 0) {
                do {
                  uVar17 = uVar30;
                  if (local_250->orig_addr[uVar30 - 100] !=
                      *(uint8_t *)((long)local_228.prev + (uVar30 - 0x24))) break;
                  uVar30 = uVar30 + 1;
                  uVar17 = uVar26;
                } while (uVar26 != uVar30);
              }
              _close_addrblock(local_1b8,writer,(rfc5444_writer_address *)local_250,(int)uVar17);
              local_1d8 = uVar17 & 0xffffffff;
            }
            plVar23 = plVar18[4].prev;
            prVar28 = local_250;
            if (plVar23->prev != plVar18[5].next) {
              puVar9 = local_250->orig_addr;
              do {
                plVar4 = plVar23[-1].prev;
                *(undefined2 *)&plVar23[5].next = 0;
                if (((prVar28 != (rfc5444_writer_message *)0x0) &&
                    (paVar19 = avl_find((avl_tree *)(puVar9 + 8),plVar4 + 2), prVar28 = local_250,
                    paVar19 != (avl_node *)0x0)) &&
                   (uVar3 = *(ushort *)&plVar23[4].next, *(ushort *)&paVar19[1].list.prev == uVar3))
                {
                  *(undefined1 *)((long)&plVar23[5].next + 1) = 1;
                  iVar15 = bcmp(plVar23[4].prev,paVar19[1].parent,(ulong)uVar3);
                  *(bool *)&plVar23[5].next = iVar15 == 0;
                  prVar28 = local_250;
                }
                plVar23 = plVar23->next;
              } while (plVar23->prev != plVar18[5].next);
            }
            last_addr = local_1d0;
            prVar16 = local_208;
            param_00 = local_238;
            if (uVar26 != 0) {
              local_1e0 = &plVar18[-3].prev;
              local_1ec = (uint)bVar1 * 8 == (int)local_200 ^ 3;
              local_200 = local_1c8 + uVar26 * 3;
              uVar17 = 0;
              do {
                bVar13 = local_1d8 < uVar17 || prVar28 == (rfc5444_writer_message *)0x0;
                bVar1 = writer->msg_addr_len;
                iVar15 = 0;
                if (local_1d8 >= uVar17 && prVar28 != (rfc5444_writer_message *)0x0) {
                  iVar15 = (uint)bVar1 - (int)uVar17;
                  if (local_1b8[uVar17].multiplen == true) {
                    iVar15 = iVar15 + 1;
                  }
                  else if ((int)local_210 == 1) {
                    iVar15 = ((iVar15 + (local_1b8[uVar17].ptr)->index) - *(int *)local_1e0) + 1;
                    local_1b8[uVar17].multiplen = true;
                  }
                }
                iVar27 = (3 - (uint)(uVar17 == 0)) + local_1ec + (uint)bVar1;
                plVar23 = plVar18[4].prev;
                plVar4 = plVar18[5].next;
                plVar5 = plVar23->prev;
                plVar7 = plVar23;
                plVar6 = plVar5;
                while (plVar6 != plVar4) {
                  plVar6 = plVar7[-1].prev;
                  iVar25 = 5 - (uint)(*(undefined1 *)((long)&plVar6->next + 1) == '\0');
                  uVar3 = *(ushort *)&plVar7[4].next;
                  uVar21 = (uint)uVar3;
                  iVar29 = (iVar25 - (uint)(uVar3 < 0x100)) + 2;
                  if (uVar3 == 0) {
                    iVar29 = iVar25;
                  }
                  iVar29 = iVar29 + (uint)uVar3;
                  if ((bVar13) || (*(undefined1 *)((long)&plVar7[5].next + 1) == '\0')) {
                    iVar15 = iVar15 + iVar29;
                  }
                  else {
                    if (*(char *)((long)&plVar6[6].next + uVar17 + 4) != '\x01') {
                      if (*(char *)&plVar7[5].next != '\0') goto LAB_00112895;
                      uVar21 = (uint)uVar3 * *(int *)((long)&plVar6[2].next + uVar17 * 4 + 4);
                    }
                    iVar15 = iVar15 + uVar21;
                  }
LAB_00112895:
                  iVar27 = iVar27 + iVar29;
                  plVar7 = plVar7->next;
                  plVar6 = plVar7->prev;
                }
                if ((bVar13) || ((int)*local_200 + iVar27 < local_1b8[uVar17].total + iVar15)) {
                  local_1b8[uVar17].ptr = (rfc5444_writer_address *)local_1e0;
                  local_1b8[uVar17].multiplen = false;
                  local_1b8[uVar17].total = (int)*local_200;
                  _Var11 = true;
                  iVar15 = iVar27;
                }
                else {
                  _Var11 = false;
                }
                local_1b8[uVar17].current = iVar15;
                if (local_250 != (rfc5444_writer_message *)0x0) {
                  local_1b8[uVar17].closed = _Var11;
                }
                if (plVar5 != plVar4) {
                  do {
                    plVar4 = plVar23[-1].prev;
                    if ((_Var11 == false) && (*(undefined1 *)((long)&plVar23[5].next + 1) != '\0'))
                    {
                      piVar24 = (int *)((long)&plVar4[2].next + uVar17 * 4 + 4);
                      *piVar24 = *piVar24 + 1;
                      uVar20 = 1;
                      if (*(char *)&plVar23[5].next == '\0') goto LAB_00112943;
                    }
                    else {
                      *(undefined4 *)((long)&plVar4[2].next + uVar17 * 4 + 4) = 1;
                      uVar20 = 0;
LAB_00112943:
                      *(undefined1 *)((long)&plVar4[6].next + uVar17 + 4) = uVar20;
                    }
                    plVar23 = plVar23->next;
                  } while (plVar23->prev != plVar18[5].next);
                }
                uVar17 = uVar17 + 1;
                prVar28 = local_250;
                local_1c8[1] = uVar26;
              } while (uVar17 != uVar26);
            }
            local_22c = local_22c + 1;
            bVar1 = writer->msg_addr_len;
            if ((ulong)bVar1 == 0) goto LAB_00112a37;
            uVar30 = 0xffffffff;
            piVar24 = &local_1b8[0].current;
            uVar17 = 0;
            uVar26 = local_1c8[0];
            do {
              uVar10 = uVar17 & 0xffffffff;
              uVar21 = *piVar24 + piVar24[-1];
              if ((int)(uint)uVar26 <= *piVar24 + piVar24[-1] ||
                  0xfe < (int)(local_218->index -
                              ((_rfc5444_internal_addr_compress_session *)(piVar24 + -3))->ptr->
                              index)) {
                uVar10 = uVar30;
                uVar21 = (uint)uVar26;
              }
              uVar30 = uVar10;
              uVar17 = uVar17 + 1;
              piVar24 = piVar24 + 6;
              uVar26 = (ulong)uVar21;
            } while (bVar1 != uVar17);
            if ((int)uVar30 == -1) goto LAB_00112a37;
            lVar31 = 0;
            do {
              piVar24 = (int *)((long)&local_1b8[0].total + lVar31);
              *piVar24 = *piVar24 + *(int *)((long)&local_1b8[0].current + lVar31);
              lVar31 = lVar31 + 0x18;
            } while ((ulong)bVar1 * 0x18 != lVar31);
            if (*(undefined1 *)((long)&plVar32[9].prev + 1) == '\0') {
              *(undefined1 *)((long)&plVar32[9].prev + 1) = 1;
              local_230 = local_230 + (*(byte *)&plVar32[9].prev ^ 1);
            }
            plVar32 = plVar32->next;
            bVar13 = false;
            last_addr = local_218;
            plVar18 = local_1f8;
          }
          if (plVar32 == plVar18) goto LAB_00112ac9;
        } while( true );
      }
      local_244 = (undefined4)CONCAT71((int7)((ulong)local_228.next >> 8),1);
      last_addr = (rfc5444_writer_address *)0x0;
      local_228.prev = local_228.next;
LAB_00112ac9:
      if (last_addr != (rfc5444_writer_address *)0x0) {
        _close_addrblock(local_1b8,writer,last_addr,0);
        _finalize_message_fragment
                  (writer,prVar16,&local_228,(_Bool)((byte)local_244 & 1),local_240,param_00);
      }
      _rfc5444_writer_free_addresses(writer,prVar16);
    }
    writer->_state = RFC5444_WRITER_NONE;
    writer->msg_addr_len = '\0';
  }
  return RFC5444_OKAY;
LAB_00112a37:
  if (local_230 == 0) {
    writer->_state = RFC5444_WRITER_NONE;
    _rfc5444_writer_free_addresses(writer,local_208);
    return RFC5444_MTU_TOO_SMALL;
  }
  plVar18 = plVar32[1].next;
  plVar23 = plVar32[1].prev;
  plVar23->next = plVar18;
  plVar18->prev = plVar23;
  plVar32[1].next = (list_entity *)0x0;
  plVar32[1].prev = (list_entity *)0x0;
  local_244 = 0;
  _close_addrblock(local_1b8,writer,local_1d0,0);
  _finalize_message_fragment(writer,prVar16,&local_228,false,local_240,param_00);
  plVar32 = &local_1e8->_addr_list_node;
  local_228.next = &local_228;
  local_228.prev = &local_228;
  if (plVar32 == local_1f8) goto LAB_00112ac9;
  goto LAB_0011255a;
}

Assistant:

enum rfc5444_result
rfc5444_writer_create_message(
  struct rfc5444_writer *writer, uint8_t msgid, uint8_t addr_len, rfc5444_writer_targetselector useIf, void *param)
{
  struct rfc5444_writer_message *msg;
  struct rfc5444_writer_content_provider *prv;
  struct list_entity *ptr1;
  struct rfc5444_writer_address *addr;
  struct rfc5444_writer_address *first_addr;
  struct rfc5444_writer_address *first_processed, *last_processed;
  struct rfc5444_writer_tlvtype *tlvtype;
  struct rfc5444_writer_target *target;
  struct list_entity current_list;

  struct rfc5444_writer_postprocessor *processor;
  size_t processor_preallocation;

  struct _rfc5444_internal_addr_compress_session acs[RFC5444_MAX_ADDRLEN];
  int best_size, best_head, same_prefixlen;
  int i, idx, non_mandatory;
  bool first;
  bool not_fragmented;
  size_t max_msg_size;
#if WRITER_STATE_MACHINE == true
  assert(writer->_state == RFC5444_WRITER_NONE);
#endif

  /* do nothing if no target is defined */
  if (list_is_empty(&writer->_targets)) {
    return RFC5444_OKAY;
  }

  /* find message create instance for the requested message */
  msg = avl_find_element(&writer->_msgcreators, &msgid, msg, _msgcreator_node);
  if (msg == NULL) {
    /* error, no msgcreator found */
    return RFC5444_NO_MSGCREATOR;
  }

  /*
   * test if we need target specific messages
   * and this is not the single_if selector
   */
  if (!msg->target_specific) {
    /* not target specific */
    writer->msg_target = NULL;
  }
  else if (useIf == rfc5444_writer_singletarget_selector) {
    /* target specific, but single_if selector is used */
    writer->msg_target = param;
  }
  else {
    /* target specific, but generic selector is used */
    enum rfc5444_result result;

    list_for_each_element(&writer->_targets, target, _target_node) {
      /* check if we should send over this target */
      if (!useIf(writer, target, param)) {
        continue;
      }

      /* create an unique message by recursive call */
      result = rfc5444_writer_create_message(writer, msgid, addr_len, rfc5444_writer_singletarget_selector, target);
      if (result != RFC5444_OKAY) {
        return result;
      }
    }
    return RFC5444_OKAY;
  }

  /* set address length */
  writer->msg_addr_len = addr_len;

  /*
   * initialize packet buffers for all interfaces if necessary
   * and calculate message MTU
   */

  /* loop over post-processors */
  processor_preallocation = 0;
  avl_for_each_element(&writer->_processors, processor, _node) {
    if (processor->is_matching_signature(processor, msg->type)) {
      processor_preallocation += processor->allocate_space;
    }
  }
  max_msg_size = writer->msg_size;
  list_for_each_element(&writer->_targets, target, _target_node) {
    size_t interface_msg_mtu;

    /* check if we should send over this target */
    if (!useIf(writer, target, param)) {
      continue;
    }

    /* start packet if necessary */
    if (target->_is_flushed) {
      _rfc5444_writer_begin_packet(writer, target);
    }

    interface_msg_mtu = target->packet_size - processor_preallocation -
                        (target->_pkt.header + target->_pkt.added + target->_pkt.allocated);
    if (interface_msg_mtu < max_msg_size) {
      max_msg_size = interface_msg_mtu;
    }
  }

  /* initialize message tlvdata */
  _rfc5444_tlv_writer_init(&writer->_msg, max_msg_size, writer->msg_size);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_HEADER;
#endif
  /* let the message creator write the message header */
  rfc5444_writer_set_msg_header(writer, msg, false, false, false, false);
  if (msg->addMessageHeader) {
    if (msg->addMessageHeader(writer, msg)) {
      /* message handler does not want this message */
#if WRITER_STATE_MACHINE == true
      writer->_state = RFC5444_WRITER_NONE;
#endif
      writer->msg_addr_len = 0;
      return RFC5444_OKAY;
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_MSGTLV;
#endif

  /* call content providers for message TLVs */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addMessageTLVs) {
      prv->addMessageTLVs(writer);
    }
  }

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_ADD_ADDRESSES;
#endif
  /* call content providers for addresses */
  avl_for_each_element(&msg->_provider_tree, prv, _provider_node) {
    if (prv->addAddresses) {
      prv->addAddresses(writer);
    }
  }

  /* join mandatory and normal address list */
  list_merge(&msg->_addr_head, &msg->_non_mandatory_addr_head);

  /* initialize list of current addresses */
  list_init_head(&current_list);
  not_fragmented = true;

  /* no addresses ? */
  if (list_is_empty(&msg->_addr_head)) {
    _finalize_message_fragment(writer, msg, &current_list, true, useIf, param);
#if WRITER_STATE_MACHINE == true
    writer->_state = RFC5444_WRITER_NONE;
#endif
    _rfc5444_writer_free_addresses(writer, msg);
    return RFC5444_OKAY;
  }

  /* start address compression */
  first = true;
  addr = first_addr = list_first_element(&msg->_addr_head, addr, _addr_list_node);

  same_prefixlen = 0;

  first_processed = NULL;
  last_processed = NULL;

  max_msg_size -= writer->_msg.header;
  max_msg_size -= writer->_msg.allocated;
  max_msg_size -= writer->_msg.added;

  /* loop through addresses */
  idx = 0;
  non_mandatory = 0;
  ptr1 = msg->_addr_head.next;
  while (ptr1 != &msg->_addr_head) {
    addr = container_of(ptr1, struct rfc5444_writer_address, _addr_list_node);
    if (addr->_done && !addr->_mandatory_addr) {
      ptr1 = ptr1->next;
      continue;
    }

    if (first) {
      /* clear message specific tlvtype information for address compression */
      list_for_each_element(&msg->_msgspecific_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear generic tlvtype information for address compression */
      list_for_each_element(&writer->_addr_tlvtype_head, tlvtype, _tlvtype_node) {
        memset(tlvtype->_tlvblock_count, 0, sizeof(tlvtype->_tlvblock_count));
        memset(tlvtype->_tlvblock_multi, 0, sizeof(tlvtype->_tlvblock_multi));
      }

      /* clear address compression session */
      memset(acs, 0, sizeof(acs));
      same_prefixlen = 1;

      first_processed = addr;
    }

    addr->index = idx++;
    list_add_tail(&current_list, &addr->_addr_fragment_node);

    /* update session with address */
    same_prefixlen = _compress_address(acs, writer, &current_list, same_prefixlen);
    first = false;

    /* look for best current compression */
    best_head = -1;
    best_size = max_msg_size + 1;
    for (i = 0; i < writer->msg_addr_len; i++) {
      int size = acs[i].total + acs[i].current;
      int count = addr->index - acs[i].ptr->index;

      /* a block of 255 addresses have an index difference of 254 */
      if (size < best_size && count <= 254) {
        best_head = i;
        best_size = size;
      }
    }

    /* fragmentation necessary ? */
    if (best_head == -1) {
      if (non_mandatory == 0) {
        /* the mandatory addresses plus one non-mandatory do not fit into a block! */
#if WRITER_STATE_MACHINE == true
        writer->_state = RFC5444_WRITER_NONE;
#endif
        _rfc5444_writer_free_addresses(writer, msg);
        return RFC5444_MTU_TOO_SMALL;
      }
      not_fragmented = false;

      /* one address too many */
      list_remove(&addr->_addr_fragment_node);

      _close_addrblock(acs, writer, last_processed, 0);
#ifdef DEBUG_OUTPUT
      printf("Finalize with head length: %d\n", last_processed->_block_headlen);
#endif
      /* write message fragment */
      _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);

      /* reset loop */
      list_init_head(&current_list);
      ptr1 = &first_processed->_addr_list_node;
      first = true;

      /* continue without stepping forward */
      continue;
    }
    else {
      /* add cost for this address to total costs */
      for (i = 0; i < writer->msg_addr_len; i++) {
        acs[i].total += acs[i].current;

#if DEBUG_CLEANUP == true
        acs[i].current = 0;
#endif
      }
      last_processed = addr;

      if (!addr->_done) {
        addr->_done = true;

        if (!addr->_mandatory_addr) {
          non_mandatory++;
        }
      }
    }

    ptr1 = ptr1->next;
  }

  if (last_processed) {
    _close_addrblock(acs, writer, last_processed, 0);

    /* write message fragment */
    _finalize_message_fragment(writer, msg, &current_list, not_fragmented, useIf, param);
  }

  /* free storage of addresses and address-tlvs */
  _rfc5444_writer_free_addresses(writer, msg);

#if WRITER_STATE_MACHINE == true
  writer->_state = RFC5444_WRITER_NONE;
#endif
  writer->msg_addr_len = 0;

  return RFC5444_OKAY;
}